

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O2

void __thiscall Assimp::Ogre::Skeleton::~Skeleton(Skeleton *this)

{
  Reset(this);
  std::_Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>::
  ~_Vector_base(&(this->animations).
                 super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
               );
  std::_Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>::~_Vector_base
            ((_Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_> *)this);
  return;
}

Assistant:

Skeleton::~Skeleton()
{
    Reset();
}